

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm-utf8check.cpp
# Opt level: O3

bool arangodb::velocypack::validate_utf8_fast_sse42(uint8_t *src,size_t len)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong uVar7;
  char cVar10;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  char cVar29;
  undefined1 auVar14 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  char cVar36;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  char cVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar49;
  char cVar50;
  char cVar51;
  undefined1 auVar37 [16];
  char cVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  char cVar61;
  char cVar64;
  char cVar65;
  char cVar66;
  char cVar67;
  char cVar68;
  char cVar69;
  char cVar70;
  char cVar71;
  char cVar72;
  char cVar73;
  char cVar74;
  char cVar75;
  char cVar76;
  char cVar77;
  undefined1 auVar62 [16];
  char cVar78;
  undefined1 auVar63 [16];
  char buffer [16];
  char cStack_29;
  undefined1 local_18 [16];
  
  if (len < 0x10) {
    auVar12 = (undefined1  [16])0x0;
    auVar31 = (undefined1  [16])0x0;
    uVar7 = 0;
    auVar56 = (undefined1  [16])0x0;
    auVar37 = (undefined1  [16])0x0;
  }
  else {
    auVar37 = (undefined1  [16])0x0;
    auVar12 = (undefined1  [16])0x0;
    uVar7 = 0;
    auVar8 = (undefined1  [16])0x0;
    auVar57 = (undefined1  [16])0x0;
    do {
      auVar31 = *(undefined1 (*) [16])(src + uVar7);
      auVar56._0_2_ = auVar31._0_2_ >> 4;
      auVar56._2_2_ = auVar31._2_2_ >> 4;
      auVar56._4_2_ = auVar31._4_2_ >> 4;
      auVar56._6_2_ = auVar31._6_2_ >> 4;
      auVar56._8_2_ = auVar31._8_2_ >> 4;
      auVar56._10_2_ = auVar31._10_2_ >> 4;
      auVar56._12_2_ = auVar31._12_2_ >> 4;
      auVar56._14_2_ = auVar31._14_2_ >> 4;
      auVar56 = auVar56 & _DAT_00113c80;
      auVar34 = psubusb(auVar31,_DAT_00113c90);
      auVar13 = pshufb(_DAT_00113ca0,auVar56);
      auVar2._16_16_ = auVar13;
      auVar2._0_16_ = auVar37;
      auVar62 = psubusb(auVar2._15_16_,_DAT_00113cb0);
      cVar10 = auVar13[0];
      cVar61 = auVar62[0] + cVar10;
      cVar15 = auVar13[1];
      cVar64 = auVar62[1] + cVar15;
      auVar3[0x11] = cVar64;
      auVar3[0x10] = cVar61;
      cVar16 = auVar13[2];
      cVar65 = auVar62[2] + cVar16;
      auVar3[0x12] = cVar65;
      cVar17 = auVar13[3];
      cVar66 = auVar62[3] + cVar17;
      auVar3[0x13] = cVar66;
      cVar18 = auVar13[4];
      cVar67 = auVar62[4] + cVar18;
      auVar3[0x14] = cVar67;
      cVar19 = auVar13[5];
      cVar68 = auVar62[5] + cVar19;
      auVar3[0x15] = cVar68;
      cVar20 = auVar13[6];
      cVar69 = auVar62[6] + cVar20;
      auVar3[0x16] = cVar69;
      cVar21 = auVar13[7];
      cVar70 = auVar62[7] + cVar21;
      auVar3[0x17] = cVar70;
      cVar22 = auVar13[8];
      cVar71 = auVar62[8] + cVar22;
      auVar3[0x18] = cVar71;
      cVar23 = auVar13[9];
      cVar72 = auVar62[9] + cVar23;
      auVar3[0x19] = cVar72;
      cVar24 = auVar13[10];
      cVar73 = auVar62[10] + cVar24;
      auVar3[0x1a] = cVar73;
      cVar25 = auVar13[0xb];
      cVar74 = auVar62[0xb] + cVar25;
      auVar3[0x1b] = cVar74;
      cVar26 = auVar13[0xc];
      cVar75 = auVar62[0xc] + cVar26;
      auVar3[0x1c] = cVar75;
      cVar27 = auVar13[0xd];
      cVar76 = auVar62[0xd] + cVar27;
      auVar3[0x1d] = cVar76;
      cVar28 = auVar13[0xe];
      cVar77 = auVar62[0xe] + cVar28;
      auVar3[0x1e] = cVar77;
      cVar29 = auVar13[0xf];
      cVar78 = auVar62[0xf] + cVar29;
      auVar3[0x1f] = cVar78;
      auVar3._0_16_ = auVar37;
      auVar13 = psubusb(auVar3._14_16_,_DAT_00113cc0);
      auVar37[0] = auVar13[0] + cVar61;
      auVar37[1] = auVar13[1] + cVar64;
      auVar37[2] = auVar13[2] + cVar65;
      auVar37[3] = auVar13[3] + cVar66;
      auVar37[4] = auVar13[4] + cVar67;
      auVar37[5] = auVar13[5] + cVar68;
      auVar37[6] = auVar13[6] + cVar69;
      auVar37[7] = auVar13[7] + cVar70;
      auVar37[8] = auVar13[8] + cVar71;
      auVar37[9] = auVar13[9] + cVar72;
      auVar37[10] = auVar13[10] + cVar73;
      auVar37[0xb] = auVar13[0xb] + cVar74;
      auVar37[0xc] = auVar13[0xc] + cVar75;
      auVar37[0xd] = auVar13[0xd] + cVar76;
      auVar37[0xe] = auVar13[0xe] + cVar77;
      auVar37[0xf] = auVar13[0xf] + cVar78;
      auVar63[0] = -(cVar10 < auVar37[0]);
      auVar63[1] = -(cVar15 < auVar37[1]);
      auVar63[2] = -(cVar16 < auVar37[2]);
      auVar63[3] = -(cVar17 < auVar37[3]);
      auVar63[4] = -(cVar18 < auVar37[4]);
      auVar63[5] = -(cVar19 < auVar37[5]);
      auVar63[6] = -(cVar20 < auVar37[6]);
      auVar63[7] = -(cVar21 < auVar37[7]);
      auVar63[8] = -(cVar22 < auVar37[8]);
      auVar63[9] = -(cVar23 < auVar37[9]);
      auVar63[10] = -(cVar24 < auVar37[10]);
      auVar63[0xb] = -(cVar25 < auVar37[0xb]);
      auVar63[0xc] = -(cVar26 < auVar37[0xc]);
      auVar63[0xd] = -(cVar27 < auVar37[0xd]);
      auVar63[0xe] = -(cVar28 < auVar37[0xe]);
      auVar63[0xf] = -(cVar29 < auVar37[0xf]);
      auVar59[0] = -(cVar10 < DAT_00113cb0);
      auVar59[1] = -(cVar15 < DAT_00113cb0._1_1_);
      auVar59[2] = -(cVar16 < DAT_00113cb0._2_1_);
      auVar59[3] = -(cVar17 < DAT_00113cb0._3_1_);
      auVar59[4] = -(cVar18 < DAT_00113cb0._4_1_);
      auVar59[5] = -(cVar19 < DAT_00113cb0._5_1_);
      auVar59[6] = -(cVar20 < DAT_00113cb0._6_1_);
      auVar59[7] = -(cVar21 < DAT_00113cb0._7_1_);
      auVar59[8] = -(cVar22 < DAT_00113cb0._8_1_);
      auVar59[9] = -(cVar23 < DAT_00113cb0._9_1_);
      auVar59[10] = -(cVar24 < DAT_00113cb0._10_1_);
      auVar59[0xb] = -(cVar25 < DAT_00113cb0._11_1_);
      auVar59[0xc] = -(cVar26 < DAT_00113cb0._12_1_);
      auVar59[0xd] = -(cVar27 < DAT_00113cb0._13_1_);
      auVar59[0xe] = -(cVar28 < DAT_00113cb0._14_1_);
      auVar59[0xf] = -(cVar29 < DAT_00113cb0._15_1_);
      auVar4._16_16_ = auVar56;
      auVar4._0_16_ = auVar57;
      auVar57 = pshufb(_DAT_00113d00,auVar4._15_16_);
      cVar10 = auVar8[0xf];
      auVar58[0] = -(cVar10 < auVar57[0]);
      cVar15 = auVar31[0];
      auVar58[1] = -(cVar15 < auVar57[1]);
      cVar16 = auVar31[1];
      auVar58[2] = -(cVar16 < auVar57[2]);
      cVar17 = auVar31[2];
      auVar58[3] = -(cVar17 < auVar57[3]);
      cVar18 = auVar31[3];
      auVar58[4] = -(cVar18 < auVar57[4]);
      cVar19 = auVar31[4];
      auVar58[5] = -(cVar19 < auVar57[5]);
      cVar20 = auVar31[5];
      auVar58[6] = -(cVar20 < auVar57[6]);
      cVar21 = auVar31[6];
      auVar58[7] = -(cVar21 < auVar57[7]);
      cVar22 = auVar31[7];
      auVar58[8] = -(cVar22 < auVar57[8]);
      cVar23 = auVar31[8];
      auVar58[9] = -(cVar23 < auVar57[9]);
      cVar24 = auVar31[9];
      auVar58[10] = -(cVar24 < auVar57[10]);
      cVar25 = auVar31[10];
      auVar58[0xb] = -(cVar25 < auVar57[0xb]);
      cVar26 = auVar31[0xb];
      auVar58[0xc] = -(cVar26 < auVar57[0xc]);
      cVar27 = auVar31[0xc];
      auVar58[0xd] = -(cVar27 < auVar57[0xd]);
      cVar28 = auVar31[0xd];
      auVar58[0xe] = -(cVar28 < auVar57[0xe]);
      cVar29 = auVar31[0xe];
      auVar58[0xf] = -(cVar29 < auVar57[0xf]);
      auVar62[0] = -(cVar10 == -0x13);
      auVar62[1] = -(cVar15 == -0x13);
      auVar62[2] = -(cVar16 == -0x13);
      auVar62[3] = -(cVar17 == -0x13);
      auVar62[4] = -(cVar18 == -0x13);
      auVar62[5] = -(cVar19 == -0x13);
      auVar62[6] = -(cVar20 == -0x13);
      auVar62[7] = -(cVar21 == -0x13);
      auVar62[8] = -(cVar22 == -0x13);
      auVar62[9] = -(cVar23 == -0x13);
      auVar62[10] = -(cVar24 == -0x13);
      auVar62[0xb] = -(cVar25 == -0x13);
      auVar62[0xc] = -(cVar26 == -0x13);
      auVar62[0xd] = -(cVar27 == -0x13);
      auVar62[0xe] = -(cVar28 == -0x13);
      auVar62[0xf] = -(cVar29 == -0x13);
      auVar60[0] = -(cVar10 == DAT_00113c90);
      auVar60[1] = -(cVar15 == DAT_00113c90._1_1_);
      auVar60[2] = -(cVar16 == DAT_00113c90._2_1_);
      auVar60[3] = -(cVar17 == DAT_00113c90._3_1_);
      auVar60[4] = -(cVar18 == DAT_00113c90._4_1_);
      auVar60[5] = -(cVar19 == DAT_00113c90._5_1_);
      auVar60[6] = -(cVar20 == DAT_00113c90._6_1_);
      auVar60[7] = -(cVar21 == DAT_00113c90._7_1_);
      auVar60[8] = -(cVar22 == DAT_00113c90._8_1_);
      auVar60[9] = -(cVar23 == DAT_00113c90._9_1_);
      auVar60[10] = -(cVar24 == DAT_00113c90._10_1_);
      auVar60[0xb] = -(cVar25 == DAT_00113c90._11_1_);
      auVar60[0xc] = -(cVar26 == DAT_00113c90._12_1_);
      auVar60[0xd] = -(cVar27 == DAT_00113c90._13_1_);
      auVar60[0xe] = -(cVar28 == DAT_00113c90._14_1_);
      auVar60[0xf] = -(cVar29 == DAT_00113c90._15_1_);
      auVar8[0] = -(-0x61 < cVar15);
      auVar8[1] = -(-0x61 < cVar16);
      auVar8[2] = -(-0x61 < cVar17);
      auVar8[3] = -(-0x61 < cVar18);
      auVar8[4] = -(-0x61 < cVar19);
      auVar8[5] = -(-0x61 < cVar20);
      auVar8[6] = -(-0x61 < cVar21);
      auVar8[7] = -(-0x61 < cVar22);
      auVar8[8] = -(-0x61 < cVar23);
      auVar8[9] = -(-0x61 < cVar24);
      auVar8[10] = -(-0x61 < cVar25);
      auVar8[0xb] = -(-0x61 < cVar26);
      auVar8[0xc] = -(-0x61 < cVar27);
      auVar8[0xd] = -(-0x61 < cVar28);
      cVar10 = auVar31[0xf];
      auVar8[0xe] = -(-0x61 < cVar29);
      auVar8[0xf] = -(-0x61 < cVar10);
      auVar14[0] = -(-0x71 < cVar15);
      auVar14[1] = -(-0x71 < cVar16);
      auVar14[2] = -(-0x71 < cVar17);
      auVar14[3] = -(-0x71 < cVar18);
      auVar14[4] = -(-0x71 < cVar19);
      auVar14[5] = -(-0x71 < cVar20);
      auVar14[6] = -(-0x71 < cVar21);
      auVar14[7] = -(-0x71 < cVar22);
      auVar14[8] = -(-0x71 < cVar23);
      auVar14[9] = -(-0x71 < cVar24);
      auVar14[10] = -(-0x71 < cVar25);
      auVar14[0xb] = -(-0x71 < cVar26);
      auVar14[0xc] = -(-0x71 < cVar27);
      auVar14[0xd] = -(-0x71 < cVar28);
      auVar14[0xe] = -(-0x71 < cVar29);
      auVar14[0xf] = -(-0x71 < cVar10);
      auVar57 = pshufb(_DAT_00113d10,auVar4._15_16_);
      auVar13[0] = -(cVar15 < auVar57[0]);
      auVar13[1] = -(cVar16 < auVar57[1]);
      auVar13[2] = -(cVar17 < auVar57[2]);
      auVar13[3] = -(cVar18 < auVar57[3]);
      auVar13[4] = -(cVar19 < auVar57[4]);
      auVar13[5] = -(cVar20 < auVar57[5]);
      auVar13[6] = -(cVar21 < auVar57[6]);
      auVar13[7] = -(cVar22 < auVar57[7]);
      auVar13[8] = -(cVar23 < auVar57[8]);
      auVar13[9] = -(cVar24 < auVar57[9]);
      auVar13[10] = -(cVar25 < auVar57[10]);
      auVar13[0xb] = -(cVar26 < auVar57[0xb]);
      auVar13[0xc] = -(cVar27 < auVar57[0xc]);
      auVar13[0xd] = -(cVar28 < auVar57[0xd]);
      auVar13[0xe] = -(cVar29 < auVar57[0xe]);
      auVar13[0xf] = -(cVar10 < auVar57[0xf]);
      auVar8 = psllw(auVar13 & auVar58 | auVar14 & auVar60 | auVar8 & auVar62 | auVar59 ^ auVar63,7)
      ;
      auVar8 = auVar8 & _DAT_00113d20;
      auVar57[0] = -(auVar8[0] < '\0');
      auVar57[1] = -(auVar8[1] < '\0');
      auVar57[2] = -(auVar8[2] < '\0');
      auVar57[3] = -(auVar8[3] < '\0');
      auVar57[4] = -(auVar8[4] < '\0');
      auVar57[5] = -(auVar8[5] < '\0');
      auVar57[6] = -(auVar8[6] < '\0');
      auVar57[7] = -(auVar8[7] < '\0');
      auVar57[8] = -(auVar8[8] < '\0');
      auVar57[9] = -(auVar8[9] < '\0');
      auVar57[10] = -(auVar8[10] < '\0');
      auVar57[0xb] = -(auVar8[0xb] < '\0');
      auVar57[0xc] = -(auVar8[0xc] < '\0');
      auVar57[0xd] = -(auVar8[0xd] < '\0');
      auVar57[0xe] = -(auVar8[0xe] < '\0');
      auVar57[0xf] = -(auVar8[0xf] < '\0');
      auVar12 = auVar57 | auVar34 | auVar12;
      uVar7 = uVar7 + 0x10;
      auVar8 = auVar31;
      auVar57 = auVar56;
    } while (uVar7 <= len - 0x10);
    uVar7 = (len - 0x10 & 0xfffffffffffffff0) + 0x10;
  }
  if (len < uVar7 || len - uVar7 == 0) {
    auVar34[0] = -('\t' < auVar37[0]);
    auVar34[1] = -('\t' < auVar37[1]);
    auVar34[2] = -('\t' < auVar37[2]);
    auVar34[3] = -('\t' < auVar37[3]);
    auVar34[4] = -('\t' < auVar37[4]);
    auVar34[5] = -('\t' < auVar37[5]);
    auVar34[6] = -('\t' < auVar37[6]);
    auVar34[7] = -('\t' < auVar37[7]);
    auVar34[8] = -('\t' < auVar37[8]);
    auVar34[9] = -('\t' < auVar37[9]);
    auVar34[10] = -('\t' < auVar37[10]);
    auVar34[0xb] = -('\t' < auVar37[0xb]);
    auVar34[0xc] = -('\t' < auVar37[0xc]);
    auVar34[0xd] = -('\t' < auVar37[0xd]);
    auVar34[0xe] = -('\t' < auVar37[0xe]);
    auVar34[0xf] = -('\x01' < auVar37[0xf]);
  }
  else {
    local_18 = (undefined1  [16])0x0;
    memcpy(local_18,src + uVar7,len - uVar7);
    auVar9._0_2_ = local_18._0_2_ >> 4;
    auVar9._2_2_ = local_18._2_2_ >> 4;
    auVar9._4_2_ = local_18._4_2_ >> 4;
    auVar9._6_2_ = local_18._6_2_ >> 4;
    auVar9._8_2_ = local_18._8_2_ >> 4;
    auVar9._10_2_ = local_18._10_2_ >> 4;
    auVar9._12_2_ = local_18._12_2_ >> 4;
    auVar9._14_2_ = local_18._14_2_ >> 4;
    auVar8 = pshufb(_DAT_00113ca0,auVar9 & _DAT_00113c80);
    auVar5._16_16_ = auVar8;
    auVar5._0_16_ = auVar37;
    auVar57 = psubusb(auVar5._15_16_,_DAT_00113cb0);
    cVar61 = auVar8[0];
    cVar36 = auVar57[0] + cVar61;
    cVar64 = auVar8[1];
    cVar38 = auVar57[1] + cVar64;
    auVar6[0x11] = cVar38;
    auVar6[0x10] = cVar36;
    cVar65 = auVar8[2];
    cVar39 = auVar57[2] + cVar65;
    auVar6[0x12] = cVar39;
    cVar66 = auVar8[3];
    cVar40 = auVar57[3] + cVar66;
    auVar6[0x13] = cVar40;
    cVar67 = auVar8[4];
    cVar41 = auVar57[4] + cVar67;
    auVar6[0x14] = cVar41;
    cVar68 = auVar8[5];
    cVar42 = auVar57[5] + cVar68;
    auVar6[0x15] = cVar42;
    cVar69 = auVar8[6];
    cVar43 = auVar57[6] + cVar69;
    auVar6[0x16] = cVar43;
    cVar70 = auVar8[7];
    cVar44 = auVar57[7] + cVar70;
    auVar6[0x17] = cVar44;
    cVar71 = auVar8[8];
    cVar45 = auVar57[8] + cVar71;
    auVar6[0x18] = cVar45;
    cVar72 = auVar8[9];
    cVar46 = auVar57[9] + cVar72;
    auVar6[0x19] = cVar46;
    cVar73 = auVar8[10];
    cVar47 = auVar57[10] + cVar73;
    auVar6[0x1a] = cVar47;
    cVar74 = auVar8[0xb];
    cVar48 = auVar57[0xb] + cVar74;
    auVar6[0x1b] = cVar48;
    cVar75 = auVar8[0xc];
    cVar49 = auVar57[0xc] + cVar75;
    auVar6[0x1c] = cVar49;
    cVar76 = auVar8[0xd];
    cVar50 = auVar57[0xd] + cVar76;
    auVar6[0x1d] = cVar50;
    cVar77 = auVar8[0xe];
    cVar51 = auVar57[0xe] + cVar77;
    auVar6[0x1e] = cVar51;
    cVar78 = auVar8[0xf];
    cVar52 = auVar57[0xf] + cVar78;
    auVar6[0x1f] = cVar52;
    auVar6._0_16_ = auVar37;
    auVar37 = psubusb(auVar6._14_16_,_DAT_00113cc0);
    auVar1._16_16_ = auVar9 & _DAT_00113c80;
    auVar1._0_16_ = auVar56;
    auVar56 = pshufb(_DAT_00113d10,auVar1._15_16_);
    cVar10 = local_18[0];
    auVar55[0] = -(cVar10 < auVar56[0]);
    cVar15 = local_18[1];
    auVar55[1] = -(cVar15 < auVar56[1]);
    cVar16 = local_18[2];
    auVar55[2] = -(cVar16 < auVar56[2]);
    cVar17 = local_18[3];
    auVar55[3] = -(cVar17 < auVar56[3]);
    cVar18 = local_18[4];
    auVar55[4] = -(cVar18 < auVar56[4]);
    cVar19 = local_18[5];
    auVar55[5] = -(cVar19 < auVar56[5]);
    cVar20 = local_18[6];
    auVar55[6] = -(cVar20 < auVar56[6]);
    cVar21 = local_18[7];
    auVar55[7] = -(cVar21 < auVar56[7]);
    cVar22 = local_18[8];
    auVar55[8] = -(cVar22 < auVar56[8]);
    cVar23 = local_18[9];
    auVar55[9] = -(cVar23 < auVar56[9]);
    cVar24 = local_18[10];
    auVar55[10] = -(cVar24 < auVar56[10]);
    cVar25 = local_18[0xb];
    auVar55[0xb] = -(cVar25 < auVar56[0xb]);
    cVar26 = local_18[0xc];
    auVar55[0xc] = -(cVar26 < auVar56[0xc]);
    cVar27 = local_18[0xd];
    auVar55[0xd] = -(cVar27 < auVar56[0xd]);
    cVar28 = local_18[0xe];
    auVar55[0xe] = -(cVar28 < auVar56[0xe]);
    cVar29 = local_18[0xf];
    auVar55[0xf] = -(cVar29 < auVar56[0xf]);
    auVar34 = psubusb(local_18,_DAT_00113c90);
    auVar35[0] = -(cVar61 < (char)(auVar37[0] + cVar36));
    auVar35[1] = -(cVar64 < (char)(auVar37[1] + cVar38));
    auVar35[2] = -(cVar65 < (char)(auVar37[2] + cVar39));
    auVar35[3] = -(cVar66 < (char)(auVar37[3] + cVar40));
    auVar35[4] = -(cVar67 < (char)(auVar37[4] + cVar41));
    auVar35[5] = -(cVar68 < (char)(auVar37[5] + cVar42));
    auVar35[6] = -(cVar69 < (char)(auVar37[6] + cVar43));
    auVar35[7] = -(cVar70 < (char)(auVar37[7] + cVar44));
    auVar35[8] = -(cVar71 < (char)(auVar37[8] + cVar45));
    auVar35[9] = -(cVar72 < (char)(auVar37[9] + cVar46));
    auVar35[10] = -(cVar73 < (char)(auVar37[10] + cVar47));
    auVar35[0xb] = -(cVar74 < (char)(auVar37[0xb] + cVar48));
    auVar35[0xc] = -(cVar75 < (char)(auVar37[0xc] + cVar49));
    auVar35[0xd] = -(cVar76 < (char)(auVar37[0xd] + cVar50));
    auVar35[0xe] = -(cVar77 < (char)(auVar37[0xe] + cVar51));
    auVar35[0xf] = -(cVar78 < (char)(auVar37[0xf] + cVar52));
    auVar11[0] = -(cVar61 < DAT_00113cb0);
    auVar11[1] = -(cVar64 < DAT_00113cb0._1_1_);
    auVar11[2] = -(cVar65 < DAT_00113cb0._2_1_);
    auVar11[3] = -(cVar66 < DAT_00113cb0._3_1_);
    auVar11[4] = -(cVar67 < DAT_00113cb0._4_1_);
    auVar11[5] = -(cVar68 < DAT_00113cb0._5_1_);
    auVar11[6] = -(cVar69 < DAT_00113cb0._6_1_);
    auVar11[7] = -(cVar70 < DAT_00113cb0._7_1_);
    auVar11[8] = -(cVar71 < DAT_00113cb0._8_1_);
    auVar11[9] = -(cVar72 < DAT_00113cb0._9_1_);
    auVar11[10] = -(cVar73 < DAT_00113cb0._10_1_);
    auVar11[0xb] = -(cVar74 < DAT_00113cb0._11_1_);
    auVar11[0xc] = -(cVar75 < DAT_00113cb0._12_1_);
    auVar11[0xd] = -(cVar76 < DAT_00113cb0._13_1_);
    auVar11[0xe] = -(cVar77 < DAT_00113cb0._14_1_);
    auVar11[0xf] = -(cVar78 < DAT_00113cb0._15_1_);
    cStack_29 = auVar31[0xf];
    auVar30[0] = -(cStack_29 == -0x13);
    auVar30[1] = -(cVar10 == -0x13);
    auVar30[2] = -(cVar15 == -0x13);
    auVar30[3] = -(cVar16 == -0x13);
    auVar30[4] = -(cVar17 == -0x13);
    auVar30[5] = -(cVar18 == -0x13);
    auVar30[6] = -(cVar19 == -0x13);
    auVar30[7] = -(cVar20 == -0x13);
    auVar30[8] = -(cVar21 == -0x13);
    auVar30[9] = -(cVar22 == -0x13);
    auVar30[10] = -(cVar23 == -0x13);
    auVar30[0xb] = -(cVar24 == -0x13);
    auVar30[0xc] = -(cVar25 == -0x13);
    auVar30[0xd] = -(cVar26 == -0x13);
    auVar30[0xe] = -(cVar27 == -0x13);
    auVar30[0xf] = -(cVar28 == -0x13);
    auVar33[0] = -(DAT_00113c90 == cStack_29);
    auVar33[1] = -(DAT_00113c90._1_1_ == cVar10);
    auVar33[2] = -(DAT_00113c90._2_1_ == cVar15);
    auVar33[3] = -(DAT_00113c90._3_1_ == cVar16);
    auVar33[4] = -(DAT_00113c90._4_1_ == cVar17);
    auVar33[5] = -(DAT_00113c90._5_1_ == cVar18);
    auVar33[6] = -(DAT_00113c90._6_1_ == cVar19);
    auVar33[7] = -(DAT_00113c90._7_1_ == cVar20);
    auVar33[8] = -(DAT_00113c90._8_1_ == cVar21);
    auVar33[9] = -(DAT_00113c90._9_1_ == cVar22);
    auVar33[10] = -(DAT_00113c90._10_1_ == cVar23);
    auVar33[0xb] = -(DAT_00113c90._11_1_ == cVar24);
    auVar33[0xc] = -(DAT_00113c90._12_1_ == cVar25);
    auVar33[0xd] = -(DAT_00113c90._13_1_ == cVar26);
    auVar33[0xe] = -(DAT_00113c90._14_1_ == cVar27);
    auVar33[0xf] = -(DAT_00113c90._15_1_ == cVar28);
    auVar54[0] = -(-0x61 < cVar10);
    auVar54[1] = -(-0x61 < cVar15);
    auVar54[2] = -(-0x61 < cVar16);
    auVar54[3] = -(-0x61 < cVar17);
    auVar54[4] = -(-0x61 < cVar18);
    auVar54[5] = -(-0x61 < cVar19);
    auVar54[6] = -(-0x61 < cVar20);
    auVar54[7] = -(-0x61 < cVar21);
    auVar54[8] = -(-0x61 < cVar22);
    auVar54[9] = -(-0x61 < cVar23);
    auVar54[10] = -(-0x61 < cVar24);
    auVar54[0xb] = -(-0x61 < cVar25);
    auVar54[0xc] = -(-0x61 < cVar26);
    auVar54[0xd] = -(-0x61 < cVar27);
    auVar54[0xe] = -(-0x61 < cVar28);
    auVar54[0xf] = -(-0x61 < cVar29);
    auVar53[0] = -(-0x71 < cVar10);
    auVar53[1] = -(-0x71 < cVar15);
    auVar53[2] = -(-0x71 < cVar16);
    auVar53[3] = -(-0x71 < cVar17);
    auVar53[4] = -(-0x71 < cVar18);
    auVar53[5] = -(-0x71 < cVar19);
    auVar53[6] = -(-0x71 < cVar20);
    auVar53[7] = -(-0x71 < cVar21);
    auVar53[8] = -(-0x71 < cVar22);
    auVar53[9] = -(-0x71 < cVar23);
    auVar53[10] = -(-0x71 < cVar24);
    auVar53[0xb] = -(-0x71 < cVar25);
    auVar53[0xc] = -(-0x71 < cVar26);
    auVar53[0xd] = -(-0x71 < cVar27);
    auVar53[0xe] = -(-0x71 < cVar28);
    auVar53[0xf] = -(-0x71 < cVar29);
    auVar31 = pshufb(_DAT_00113d00,auVar1._15_16_);
    auVar32[0] = -(cStack_29 < auVar31[0]);
    auVar32[1] = -(cVar10 < auVar31[1]);
    auVar32[2] = -(cVar15 < auVar31[2]);
    auVar32[3] = -(cVar16 < auVar31[3]);
    auVar32[4] = -(cVar17 < auVar31[4]);
    auVar32[5] = -(cVar18 < auVar31[5]);
    auVar32[6] = -(cVar19 < auVar31[6]);
    auVar32[7] = -(cVar20 < auVar31[7]);
    auVar32[8] = -(cVar21 < auVar31[8]);
    auVar32[9] = -(cVar22 < auVar31[9]);
    auVar32[10] = -(cVar23 < auVar31[10]);
    auVar32[0xb] = -(cVar24 < auVar31[0xb]);
    auVar32[0xc] = -(cVar25 < auVar31[0xc]);
    auVar32[0xd] = -(cVar26 < auVar31[0xd]);
    auVar32[0xe] = -(cVar27 < auVar31[0xe]);
    auVar32[0xf] = -(cVar28 < auVar31[0xf]);
    auVar37 = psllw(auVar55 & auVar32 | auVar53 & auVar33 | auVar54 & auVar30 | auVar11 ^ auVar35,7)
    ;
    auVar37 = auVar37 & _DAT_00113d20;
    auVar31[0] = -(auVar37[0] < '\0');
    auVar31[1] = -(auVar37[1] < '\0');
    auVar31[2] = -(auVar37[2] < '\0');
    auVar31[3] = -(auVar37[3] < '\0');
    auVar31[4] = -(auVar37[4] < '\0');
    auVar31[5] = -(auVar37[5] < '\0');
    auVar31[6] = -(auVar37[6] < '\0');
    auVar31[7] = -(auVar37[7] < '\0');
    auVar31[8] = -(auVar37[8] < '\0');
    auVar31[9] = -(auVar37[9] < '\0');
    auVar31[10] = -(auVar37[10] < '\0');
    auVar31[0xb] = -(auVar37[0xb] < '\0');
    auVar31[0xc] = -(auVar37[0xc] < '\0');
    auVar31[0xd] = -(auVar37[0xd] < '\0');
    auVar31[0xe] = -(auVar37[0xe] < '\0');
    auVar31[0xf] = -(auVar37[0xf] < '\0');
    auVar34 = auVar31 | auVar34;
  }
  return auVar12 == (undefined1  [16])0x0 && auVar34 == (undefined1  [16])0x0;
}

Assistant:

bool validate_utf8_fast_sse42(uint8_t const* src, std::size_t len) {
  std::size_t i = 0;
  __m128i has_error = _mm_setzero_si128();
  struct processed_utf_bytes previous = {
      .rawbytes = _mm_setzero_si128(),
      .high_nibbles = _mm_setzero_si128(),
      .carried_continuations = _mm_setzero_si128()};
  if (len >= 16) {
    for (; i <= len - 16; i += 16) {
      __m128i current_bytes = _mm_loadu_si128((const __m128i*)(src + i));
      previous = checkUTF8Bytes(current_bytes, &previous, &has_error);
    }
  }

  // last part
  if (i < len) {
    char buffer[16];
    memset(buffer, 0, 16);
    memcpy(buffer, src + i, len - i);
    __m128i current_bytes = _mm_loadu_si128((const __m128i*)(buffer));
    previous = checkUTF8Bytes(current_bytes, &previous, &has_error);
  } else {
    has_error = _mm_or_si128(
        _mm_cmpgt_epi8(
            previous.carried_continuations,
            _mm_setr_epi8(9, 9, 9, 9, 9, 9, 9, 9, 9, 9, 9, 9, 9, 9, 9, 1)),
        has_error);
  }

  return _mm_testz_si128(has_error, has_error);
}